

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  lu_byte *plVar1;
  unsigned_short *puVar2;
  FuncState *fs;
  bool bVar3;
  int iVar4;
  BinOpr BVar5;
  uint uVar6;
  BinOpr op;
  UnOpr op_00;
  expdesc v2;
  expdesc local_48;
  
  uVar6 = *(int *)&ls->L->nCcalls + 1;
  ls->L->nCcalls = (unsigned_short)uVar6;
  if (200 < (uVar6 & 0xffff)) {
    luaX_lexerror(ls,"chunk has too many syntax levels",0);
  }
  iVar4 = (ls->t).token;
  if (iVar4 == 0x23) {
    op_00 = OPR_LEN;
LAB_00110a6a:
    bVar3 = false;
  }
  else {
    if (iVar4 == 0x10e) {
      op_00 = OPR_NOT;
      goto LAB_00110a6a;
    }
    if (iVar4 == 0x2d) {
      bVar3 = false;
      op_00 = OPR_MINUS;
    }
    else {
      op_00 = OPR_NOUNOPR;
      bVar3 = true;
    }
  }
  if (!bVar3) {
    luaX_next(ls);
    subexpr(ls,v,8);
    luaK_prefix(ls->fs,op_00,v);
    goto LAB_00110c10;
  }
  if (iVar4 < 0x113) {
    if (iVar4 < 0x109) {
      if (iVar4 != 0x7b) {
        if (iVar4 == 0x107) {
          v->t = -1;
          v->f = -1;
          v->k = VFALSE;
LAB_00110bc4:
          (v->u).s.info = 0;
          goto LAB_00110c08;
        }
        goto LAB_00110ce3;
      }
      constructor(ls,v);
    }
    else {
      if (iVar4 != 0x109) {
        if (iVar4 == 0x10d) {
          v->t = -1;
          v->f = -1;
          v->k = VNIL;
          goto LAB_00110bc4;
        }
        goto LAB_00110ce3;
      }
      luaX_next(ls);
      body(ls,v,0,ls->linenumber);
    }
  }
  else {
    if (iVar4 < 0x11c) {
      if (iVar4 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_00110bc4;
      }
      if (iVar4 == 0x117) {
        fs = ls->fs;
        if (fs->f->is_vararg == '\0') {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        plVar1 = &fs->f->is_vararg;
        *plVar1 = *plVar1 & 0xfb;
        iVar4 = luaK_codeABC(fs,OP_VARARG,0,1,0);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        goto LAB_00110c04;
      }
    }
    else {
      if (iVar4 == 0x11e) {
        iVar4 = luaK_stringK(ls->fs,(ls->t).seminfo.ts);
        v->t = -1;
        v->f = -1;
        v->k = VK;
LAB_00110c04:
        (v->u).s.info = iVar4;
LAB_00110c08:
        luaX_next(ls);
        goto LAB_00110c10;
      }
      if (iVar4 == 0x11c) {
        v->t = -1;
        v->f = -1;
        v->k = VKNUM;
        (v->u).s.info = 0;
        v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
        goto LAB_00110c08;
      }
    }
LAB_00110ce3:
    primaryexp(ls,v);
  }
LAB_00110c10:
  iVar4 = (ls->t).token;
  if (iVar4 < 0x5e) {
    switch(iVar4) {
    case 0x25:
      op = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_00110c2e_caseD_26:
      op = OPR_NOBINOPR;
      bVar3 = true;
      goto LAB_00110cfb;
    case 0x2a:
      op = OPR_MUL;
      break;
    case 0x2b:
      bVar3 = false;
      op = OPR_ADD;
      goto LAB_00110cfb;
    case 0x2d:
      op = OPR_SUB;
      break;
    case 0x2f:
      op = OPR_DIV;
      break;
    default:
      if (iVar4 == 0x3c) {
        op = OPR_LT;
      }
      else {
        if (iVar4 != 0x3e) goto switchD_00110c2e_caseD_26;
        op = OPR_GT;
      }
    }
  }
  else {
    switch(iVar4) {
    case 0x10f:
      op = OPR_OR;
      break;
    case 0x110:
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x117:
      goto switchD_00110c2e_caseD_26;
    case 0x116:
      op = OPR_CONCAT;
      break;
    case 0x118:
      op = OPR_EQ;
      break;
    case 0x119:
      op = OPR_GE;
      break;
    case 0x11a:
      op = OPR_LE;
      break;
    case 0x11b:
      op = OPR_NE;
      break;
    default:
      if (iVar4 == 0x5e) {
        op = OPR_POW;
      }
      else {
        if (iVar4 != 0x101) goto switchD_00110c2e_caseD_26;
        op = OPR_AND;
      }
    }
  }
  bVar3 = false;
LAB_00110cfb:
  if (!bVar3) {
    do {
      if (priority[op].left <= limit) break;
      luaX_next(ls);
      luaK_infix(ls->fs,op,v);
      BVar5 = subexpr(ls,&local_48,(uint)priority[op].right);
      luaK_posfix(ls->fs,op,v,&local_48);
      op = BVar5;
    } while (BVar5 != OPR_NOBINOPR);
  }
  puVar2 = &ls->L->nCcalls;
  *puVar2 = *puVar2 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, unsigned int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    luaX_next(ls);
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than `limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}